

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void ramdump(uint32_t base_address,uint32_t size)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint uVar10;
  
  if (size != 0) {
    bVar1 = true;
    uVar10 = 0;
    do {
      uVar2 = gba_read_half(base_address + uVar10,ACCESS_UNKNOWN);
      uVar3 = gba_read_half(base_address + uVar10 + 2,ACCESS_UNKNOWN);
      uVar4 = gba_read_half(base_address + uVar10 + 4,ACCESS_UNKNOWN);
      uVar5 = gba_read_half(base_address + uVar10 + 6,ACCESS_UNKNOWN);
      uVar6 = gba_read_half(base_address + uVar10 + 8,ACCESS_UNKNOWN);
      uVar7 = gba_read_half(base_address + uVar10 + 10,ACCESS_UNKNOWN);
      uVar8 = gba_read_half(base_address + uVar10 + 0xc,ACCESS_UNKNOWN);
      uVar9 = gba_read_half(base_address + uVar10 + 0xe,ACCESS_UNKNOWN);
      if ((((uVar9 != 0 || uVar8 != 0) || (uVar7 != 0 || uVar6 != 0)) || (uVar5 != 0 || uVar4 != 0))
          || (uVar3 != 0 || uVar2 != 0)) {
        bVar1 = false;
      }
      printf("%08X: %04X %04X %04X %04X %04X %04X %04X %04X\n",(ulong)(base_address + uVar10),
             (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,
             (ulong)uVar8,(ulong)uVar9);
      uVar10 = uVar10 + 0x10;
    } while (uVar10 < size);
    if (!bVar1) {
      return;
    }
  }
  puts("Warning: all zeroes!");
  return;
}

Assistant:

void ramdump(word base_address, word size) {
    bool allzeroes = true;
    for (int x = 0; x < size; x += 0x10) {
        half a = gba_read_half(base_address + x, ACCESS_UNKNOWN);
        half b = gba_read_half(base_address + x + 0x2, ACCESS_UNKNOWN);
        half c = gba_read_half(base_address + x + 0x4, ACCESS_UNKNOWN);
        half d = gba_read_half(base_address + x + 0x6, ACCESS_UNKNOWN);
        half e = gba_read_half(base_address + x + 0x8, ACCESS_UNKNOWN);
        half f = gba_read_half(base_address + x + 0xA, ACCESS_UNKNOWN);
        half g = gba_read_half(base_address + x + 0xC, ACCESS_UNKNOWN);
        half h = gba_read_half(base_address + x + 0xE, ACCESS_UNKNOWN);
        if (a != 0 || b != 0 || c != 0 || d != 0 || e != 0 || f != 0 || g != 0 || h != 0) {
            allzeroes = false;
        }
        printf("%08X: %04X %04X %04X %04X %04X %04X %04X %04X\n",
               base_address + x, a, b, c, d, e, f, g, h);
    }
    if (allzeroes) {
        printf("Warning: all zeroes!\n");
    }
}